

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O3

shared_ptr<(anonymous_namespace)::schema> __thiscall
anon_unknown.dwarf_41b1a::schema_ref::make_for_default_
          (schema_ref *this,shared_ptr<(anonymous_namespace)::schema> *sch,root_schema *root,
          vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *uris,json *default_value)

{
  _Manager_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  root_schema *prVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  json *in_R9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<(anonymous_namespace)::schema> sVar2;
  string local_50;
  
  nlohmann::json_uri::to_string_abi_cxx11_(&local_50,*(json_uri **)default_value);
  prVar1 = (root_schema *)operator_new(0x70);
  *(undefined8 *)((long)&(prVar1->loader_).super__Function_base._M_functor + 8) = 0x100000001;
  *(undefined ***)&(prVar1->loader_).super__Function_base._M_functor =
       &PTR___Sp_counted_ptr_inplace_001570f8;
  this_00 = &(prVar1->loader_).super__Function_base._M_manager;
  schema_ref((schema_ref *)this_00,&local_50,(root_schema *)uris);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (prVar1->content_check_).super__Function_base._M_manager =
       *(_Manager_type *)&(root->loader_).super__Function_base._M_functor;
  __r = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
        ((long)&(root->loader_).super__Function_base._M_functor + 8);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&(prVar1->content_check_)._M_invoker,__r);
  (prVar1->root_).super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = *(element_type **)&(root->loader_).super__Function_base._M_functor;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(prVar1->root_).
              super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__r);
  schema::set_default_value((schema *)this_00,in_R9);
  (this->super_schema)._vptr_schema = (_func_int **)this_00;
  (this->super_schema).root_ = prVar1;
  sVar2.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_schema;
  return (shared_ptr<(anonymous_namespace)::schema>)
         sVar2.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<schema> make_for_default_(
	    std::shared_ptr<::schema> &sch,
	    root_schema *root,
	    std::vector<nlohmann::json_uri> &uris,
	    nlohmann::json &default_value) const override
	{
		// create a new reference schema using the original reference (which will be resolved later)
		// to store this overloaded default value #209
		auto result = std::make_shared<schema_ref>(uris[0].to_string(), root);
		result->set_target(sch, true);
		result->set_default_value(default_value);
		return result;
	}